

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
SquareRootUnscentedKalmanFilter_updateStateCovariance_Test::TestBody
          (SquareRootUnscentedKalmanFilter_updateStateCovariance_Test *this)

{
  float fVar1;
  bool bVar2;
  ComputationInfo CVar3;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar4;
  char *pcVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar6;
  long lVar7;
  Index IVar8;
  Scalar *pSVar9;
  char *in_R9;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i;
  Message local_3a8;
  Index local_3a0;
  Index local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_1;
  Message local_378;
  Index local_370;
  Index local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  Matrix<T,_3,_3> P;
  AssertHelper local_308;
  Message local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar__1;
  TransposeReturnType TStack_2e0;
  bool success;
  undefined1 local_2d8 [16];
  Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0> local_2c8;
  Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>
  local_2b8;
  MatrixType local_29c;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>_>
  local_278;
  undefined1 local_24c [8];
  Matrix<T,_3,_3> P_ref;
  Scalar local_220;
  Scalar local_21c;
  Scalar local_218;
  Scalar local_214;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> local_210;
  undefined1 local_1ec [8];
  Matrix<T,_3,_2> K;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>
  local_188;
  undefined1 local_168 [8];
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S_y;
  Scalar local_140;
  Scalar local_13c;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_138;
  undefined1 local_108 [8];
  Matrix<T,_2,_2> Ssquared;
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  SquareRootUnscentedKalmanFilter_updateStateCovariance_Test *this_local;
  
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info = 0x40000000;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x3f8000;
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)
             (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array + 2),1.0,2.0,1.0);
  Eigen::Matrix<float,_2,_2,_0,_2,_2>::Matrix((Matrix<float,_2,_2,_0,_2,_2> *)local_108);
  local_13c = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator<<
            (&local_138,(DenseBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_108,&local_13c);
  local_140 = 0.1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (&local_138,&local_140);
  S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._28_4_ = 0x3dcccccd;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar4,(Scalar *)
                             &S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.field_0x1c);
  S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_info = 0x3f000000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
            (pCVar4,(Scalar *)&S_y.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_info);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_138);
  Kalman::Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::Cholesky
            ((Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)local_168);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3fb999999999999a;
  Eigen::operator*(&local_188,(double *)&gtest_ar_.message_,(StorageBaseType *)local_108);
  Eigen::LLT<Eigen::Matrix<float,2,2,0,2,2>,1>::
  compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,2,2,0,2,2>const>const,Eigen::Matrix<float,2,2,0,2,2>const>>
            ((LLT<Eigen::Matrix<float,2,2,0,2,2>,1> *)local_168,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>_>
              *)&local_188);
  CVar3 = Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::info
                    ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)local_168);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_1a0,CVar3 == Success);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 5),(internal *)local_1a0,(AssertionResult *)"S_y.info() == Eigen::Success","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xa0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 5));
    testing::Message::~Message(&local_1a8);
  }
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       (float)(uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] == 0.0
     ) {
    Eigen::Matrix<float,_3,_2,_0,_3,_2>::Matrix((Matrix<float,_3,_2,_0,_3,_2> *)local_1ec);
    local_214 = 0.17840852;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator<<
              (&local_210,(DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_1ec,&local_214);
    local_218 = -0.30410543;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (&local_210,&local_218);
    local_21c = -1.1109985;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,&local_21c);
    local_220 = 0.8028383;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,&local_220);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         -1.2461565;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 8);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         0.063524246;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar6,P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 7);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::~CommaInitializer(&local_210);
    Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::setIdentity
              ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
               &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
    Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
              (&local_29c,
               (LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
               &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
    Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::reconstructedMatrix
              ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)local_2d8);
    local_2c8 = Eigen::MatrixBase<Eigen::Matrix<float,3,2,0,3,2>>::operator*
                          ((MatrixBase<Eigen::Matrix<float,3,2,0,3,2>> *)local_1ec,
                           (MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_2d8);
    TStack_2e0 = Eigen::DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::transpose
                           ((DenseBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_1ec);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<float,3,2,0,3,2>,Eigen::Matrix<float,2,2,0,2,2>,0>>::
    operator*(&local_2b8,
              (MatrixBase<Eigen::Product<Eigen::Matrix<float,3,2,0,3,2>,Eigen::Matrix<float,2,2,0,2,2>,0>>
               *)&local_2c8,
              (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>_> *)
              &stack0xfffffffffffffd20);
    Eigen::MatrixBase<Eigen::Matrix<float,3,3,0,3,3>>::operator-
              (&local_278,(MatrixBase<Eigen::Matrix<float,3,3,0,3,3>> *)&local_29c,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>_>
                *)&local_2b8);
    Eigen::Matrix<float,3,3,0,3,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,3,0,3,3>const,Eigen::Product<Eigen::Product<Eigen::Matrix<float,3,2,0,3,2>,Eigen::Matrix<float,2,2,0,2,2>,0>,Eigen::Transpose<Eigen::Matrix<float,3,2,0,3,2>>,0>const>>
              ((Matrix<float,3,3,0,3,3> *)local_24c,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>_>_>
                *)&local_278);
    gtest_ar__1.message_.ptr_._7_1_ =
         Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
         updateStateCovariance<Kalman::Vector<float,_2>_>
                   ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)
                    (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                     m_data.array + 2),(KalmanGain<Kalman::Vector<float,_2>_> *)local_1ec,
                    (CovarianceSquareRoot<Kalman::Vector<float,_2>_> *)local_168);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)local_2f8,(bool)gtest_ar__1.message_.ptr_._7_1_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar2) {
      testing::Message::Message(&local_300);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 7),(internal *)local_2f8,(AssertionResult *)"success","false","true",in_R9
                );
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0xb1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      std::__cxx11::string::~string
                ((string *)
                 (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 7));
      testing::Message::~Message(&local_300);
    }
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         (float)(uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] ==
        0.0) {
      Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
                ((MatrixType *)((long)&gtest_ar.message_.ptr_ + 4),
                 (LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                 &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
      local_368 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_24c);
      local_370 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                             ((long)&gtest_ar.message_.ptr_ + 4));
      testing::internal::EqHelper<false>::Compare<long,long>
                ((EqHelper<false> *)local_360,"P_ref.rows()","P.rows()",&local_368,&local_370);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
      if (!bVar2) {
        testing::Message::Message(&local_378);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                   ,0xb5,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_378);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_378);
      }
      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
           (float)(uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
      if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] ==
          0.0) {
        local_398 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_24c);
        local_3a0 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                               ((long)&gtest_ar.message_.ptr_ + 4));
        testing::internal::EqHelper<false>::Compare<long,long>
                  ((EqHelper<false> *)local_390,"P_ref.cols()","P.cols()",&local_398,&local_3a0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
        if (!bVar2) {
          testing::Message::Message(&local_3a8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&j,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                     ,0xb5,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&j,&local_3a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j);
          testing::Message::~Message(&local_3a8);
        }
        K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
             (float)(uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
        if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4]
            == 0.0) {
          gtest_ar_2.message_.ptr_._4_4_ = 0;
          while( true ) {
            lVar7 = (long)gtest_ar_2.message_.ptr_._4_4_;
            IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::rows
                              ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_24c);
            if (IVar8 <= lVar7) break;
            gtest_ar_2.message_.ptr_._0_4_ = 0;
            while( true ) {
              lVar7 = (long)(int)gtest_ar_2.message_.ptr_;
              IVar8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::cols
                                ((PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_24c)
              ;
              if (IVar8 <= lVar7) break;
              pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                                  local_24c,(long)gtest_ar_2.message_.ptr_._4_4_,
                                  (long)(int)gtest_ar_2.message_.ptr_);
              fVar1 = *pSVar9;
              pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                                  ((long)&gtest_ar.message_.ptr_ + 4),
                                  (long)gtest_ar_2.message_.ptr_._4_4_,
                                  (long)(int)gtest_ar_2.message_.ptr_);
              testing::internal::DoubleNearPredFormat
                        ((internal *)local_3c8,"P_ref(i,j)","P(i,j)","1e-6",(double)fVar1,
                         (double)*pSVar9,1e-06);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
              if (!bVar2) {
                testing::Message::Message(&local_3d0);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_3d8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                           ,0xb5,pcVar5);
                testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
                testing::internal::AssertHelper::~AssertHelper(&local_3d8);
                testing::Message::~Message(&local_3d0);
              }
              K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
              [4] = (float)(uint)!bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
              if (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array[4] != 0.0) goto LAB_003b36c3;
              gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1;
            }
            gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1;
          }
          K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
               0.0;
        }
      }
    }
  }
LAB_003b36c3:
  Kalman::Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::~Cholesky
            ((Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)local_168);
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  ~SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)
             (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array + 2));
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, updateStateCovariance) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Setup S_y
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        1, 0.1,
        0.1, 0.5;
    Cholesky<Matrix<T,2,2>> S_y;
    S_y.compute(0.1*Ssquared);
    ASSERT_TRUE(S_y.info() == Eigen::Success);
    
    // Setup Kalman Gain
    Matrix<T, 3, 2> K;
    K <<
        0.178408514951850, -0.304105423213381,
       -1.110998479472884,  0.802838317283324,
       -1.246156445345498,  0.063524243960128;
    
    // Setup S
    ukf.S.setIdentity();
    
    // Setup reference value for S (computed from regular UKF formula)
    Matrix<T,3,3> P_ref = ukf.S.reconstructedMatrix() - K * S_y.reconstructedMatrix() * K.transpose();

    // Perform update
    bool success = ukf.updateStateCovariance<Vector<T,2>>(K, S_y);
    ASSERT_TRUE(success);

    Matrix<T,3,3> P = ukf.S.reconstructedMatrix();
    
    ASSERT_MATRIX_NEAR(P_ref, P, 1e-6);
}